

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool testPty(StringRef *cmdLine)

{
  bool bVar1;
  uint uVar2;
  __pid_t _Var3;
  int iVar4;
  ErrorHdr *pEVar5;
  File *this;
  undefined8 in_RCX;
  undefined8 uVar6;
  size_t sVar7;
  int __oflag;
  int __fd;
  winsize winSize;
  File stdinFile;
  size_t size;
  char buffer [256];
  fd_set *__arr;
  uint __i;
  fd_set rdset;
  pid_t pid;
  Error error;
  bool result;
  Pipe execPipe;
  File slavePty;
  Pty masterPty;
  int in_stack_fffffffffffffd38;
  uint_t in_stack_fffffffffffffd3c;
  winsize *in_stack_fffffffffffffd40;
  Pipe *in_stack_fffffffffffffd48;
  Pipe *in_stack_fffffffffffffd50;
  File *this_00;
  Pty *in_stack_fffffffffffffd68;
  Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *this_01;
  ErrorRef *in_stack_fffffffffffffd70;
  bool local_26e;
  uint local_228;
  int in_stack_fffffffffffffddc;
  int in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  uint local_114;
  File local_110 [24];
  StringRef *in_stack_ffffffffffffff50;
  Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef> local_70;
  undefined4 local_58;
  byte local_51;
  char local_50 [35];
  undefined1 local_2d;
  File local_2c;
  Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> local_28 [4];
  Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> local_18;
  Pty local_14 [4];
  byte local_1;
  
  printf("Opening master PTY...\n");
  axl::io::psx::Pty::Pty((Pty *)0x1193fa);
  axl::io::psx::File::File((File *)0x119407);
  axl::io::psx::Pipe::Pipe(in_stack_fffffffffffffd50);
  local_51 = 0;
  uVar2 = axl::io::psx::Pty::open(local_14,(char *)0x2,__oflag);
  sVar7 = CONCAT71((int7)((ulong)in_RCX >> 8),(char)uVar2);
  local_26e = false;
  if ((uVar2 & 1) != 0) {
    bVar1 = axl::io::psx::Pty::grant((Pty *)in_stack_fffffffffffffd40);
    sVar7 = CONCAT71((int7)(sVar7 >> 8),bVar1);
    local_26e = false;
    if (bVar1) {
      bVar1 = axl::io::psx::Pty::unlock((Pty *)in_stack_fffffffffffffd40);
      sVar7 = CONCAT71((int7)(sVar7 >> 8),bVar1);
      local_26e = false;
      if (bVar1) {
        bVar1 = axl::io::psx::File::setBlockingMode
                          (&in_stack_fffffffffffffd48->m_readFile,
                           SUB81((ulong)in_stack_fffffffffffffd40 >> 0x38,0));
        sVar7 = CONCAT71((int7)(sVar7 >> 8),bVar1);
        local_26e = false;
        if (bVar1) {
          axl::io::psx::Pty::getSlaveFileName(in_stack_fffffffffffffd68);
          local_51 = 1;
          uVar6 = 0x1b6;
          uVar2 = axl::io::psx::File::open((File *)&local_18,local_50,0x42,0x1b6);
          sVar7 = CONCAT71((int7)((ulong)uVar6 >> 8),(char)uVar2);
          local_26e = false;
          if ((uVar2 & 1) != 0) {
            local_26e = axl::io::psx::Pipe::create(in_stack_fffffffffffffd48);
          }
        }
      }
    }
  }
  if ((local_51 & 1) != 0) {
    axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x119553);
  }
  local_2d = local_26e;
  if (local_26e == false) {
    local_1 = 0;
    local_58 = 1;
  }
  else {
    iVar4 = 2;
    axl::io::psx::File::fcntl<int>
              ((File *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38
              );
    axl::err::Error::Error((Error *)0x119629);
    _Var3 = fork();
    if (_Var3 == -1) {
      axl::err::setLastSystemError();
      local_1 = 0;
      local_58 = 1;
    }
    else {
      if (_Var3 == 0) {
        setsid();
        axl::io::psx::File::ioctl<int>
                  ((File *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,
                   in_stack_fffffffffffffd38);
        iVar4 = axl::sl::Handle::operator_cast_to_int((Handle *)&local_18);
        dup2(iVar4,0);
        iVar4 = axl::sl::Handle::operator_cast_to_int((Handle *)&local_18);
        dup2(iVar4,1);
        iVar4 = axl::sl::Handle::operator_cast_to_int((Handle *)&local_18);
        __fd = 2;
        dup2(iVar4,2);
        axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::close
                  (&local_18,__fd);
        exec(in_stack_ffffffffffffff50);
        axl::err::getLastError();
        axl::err::Error::operator=
                  ((Error *)in_stack_fffffffffffffd40,
                   (ErrorRef *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        axl::err::ErrorRef::~ErrorRef((ErrorRef *)0x11975a);
        this_01 = local_28;
        pEVar5 = axl::rc::Buf::operator_cast_to_ErrorHdr_((Buf *)&local_70);
        iVar4 = (int)pEVar5;
        pEVar5 = axl::rc::Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>::
                 operator->(&local_70);
        axl::io::psx::File::write((File *)this_01,iVar4,(void *)(ulong)pEVar5->m_size,sVar7);
        axl::io::psx::File::flush((File *)in_stack_fffffffffffffd40);
        _exit(-1);
      }
      axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::close(local_28,iVar4);
      axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::close(&local_18,iVar4)
      ;
      for (local_114 = 0; local_114 < 0x10; local_114 = local_114 + 1) {
        *(undefined8 *)(local_110 + (ulong)local_114 * 2) = 0;
      }
      iVar4 = axl::sl::Handle::operator_cast_to_int((Handle *)&local_2c);
      this = (File *)(1L << ((byte)iVar4 & 0x3f));
      this_00 = local_110;
      iVar4 = axl::sl::Handle::operator_cast_to_int((Handle *)&local_2c);
      if (iVar4 < 0) {
        iVar4 = iVar4 + 0x3f;
      }
      sVar7 = (size_t)(iVar4 >> 6);
      *(ulong *)(this_00 + sVar7 * 2) = *(ulong *)(this_00 + sVar7 * 2) | (ulong)this;
      in_stack_fffffffffffffd40 =
           (winsize *)axl::io::psx::File::read(&local_2c,(int)&local_228,(void *)0x100,sVar7);
      if ((in_stack_fffffffffffffd40 == (winsize *)0x0) ||
         (in_stack_fffffffffffffd40 == (winsize *)0xffffffffffffffff)) {
        axl::io::psx::File::File((File *)0x119a08);
        axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::attach
                  ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)
                   in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
        axl::io::psx::File::setBlockingMode(this,SUB81((ulong)in_stack_fffffffffffffd40 >> 0x38,0));
        axl::io::psx::File::ioctl<winsize*>
                  (this_00,(uint_t)((ulong)this >> 0x20),in_stack_fffffffffffffd40);
        axl::sl::Handle::operator_cast_to_int((Handle *)local_14);
        axl::sl::Handle::operator_cast_to_int((Handle *)local_14);
        pumpChildStdio(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0,in_stack_fffffffffffffddc
                      );
        local_1 = 1;
        local_58 = 1;
        axl::io::psx::File::~File((File *)0x119aa2);
      }
      else {
        if ((winsize *)(ulong)local_228 == in_stack_fffffffffffffd40) {
          axl::err::ErrorRef::ErrorRef
                    ((ErrorRef *)in_stack_fffffffffffffd40,
                     (ErrorHdr *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
          axl::err::setError((ErrorRef *)0x119961);
          axl::err::ErrorRef::~ErrorRef((ErrorRef *)0x119970);
        }
        else {
          axl::err::ErrorRef::ErrorRef(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
          axl::err::setError((ErrorRef *)0x1199b5);
          axl::err::ErrorRef::~ErrorRef((ErrorRef *)0x1199c1);
        }
        local_1 = 0;
        local_58 = 1;
      }
    }
    axl::err::Error::~Error((Error *)0x119ad1);
  }
  axl::io::psx::Pipe::~Pipe((Pipe *)in_stack_fffffffffffffd40);
  axl::io::psx::File::~File((File *)0x119afc);
  axl::io::psx::Pty::~Pty((Pty *)0x119b09);
  return (bool)(local_1 & 1);
}

Assistant:

bool
testPty(const sl::StringRef& cmdLine) {
	printf("Opening master PTY...\n");

	axl::io::psx::Pty masterPty;
	axl::io::psx::File slavePty;
	axl::io::psx::Pipe execPipe;

	bool result =
		masterPty.open() &&
		masterPty.grant() &&
		masterPty.unlock() &&
		masterPty.setBlockingMode(false) &&
		slavePty.open(masterPty.getSlaveFileName()) &&
		execPipe.create();

	if (!result)
		return false;

	execPipe.m_writeFile.fcntl(F_SETFD, FD_CLOEXEC);
	err::Error error;

	pid_t pid = ::fork();
	switch (pid) {
	case -1:
		err::setLastSystemError();
		return false;

	case 0:
		::setsid();

		slavePty.ioctl(TIOCSCTTY, (int)0);

		::dup2(slavePty, STDIN_FILENO);
		::dup2(slavePty, STDOUT_FILENO);
		::dup2(slavePty, STDERR_FILENO);

		slavePty.close();

		exec(cmdLine);

		error = err::getLastError();
		execPipe.m_writeFile.write(error, error->m_size);
		execPipe.m_writeFile.flush();

		::_exit(-1);
		ASSERT(false);

	default:
		execPipe.m_writeFile.close();
		slavePty.close();

		fd_set rdset;
		FD_ZERO(&rdset);
		FD_SET(execPipe.m_readFile, &rdset);

		char buffer[256];
		size_t size = execPipe.m_readFile.read(buffer, sizeof(buffer));
		if (size == 0 || size == -1)
			break;

		if (((err::ErrorHdr*)buffer)->m_size == size)
			err::setError((err::ErrorHdr*)buffer);
		else
			err::setError("POSIX execvpe failed"); // unlikely fallback

		return false;
	}

	axl::io::psx::File stdinFile;
	stdinFile.attach(STDIN_FILENO);
	stdinFile.setBlockingMode(false);

	struct winsize winSize;
	winSize.ws_col = 90;
	winSize.ws_row = 40;
	masterPty.ioctl(TIOCSWINSZ, &winSize);

	pumpChildStdio(masterPty, masterPty, -1);
	return true;
}